

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumNoInline
               (CodedInputStream *input,_func_bool_int *is_valid,RepeatedField<int> *values)

{
  uint8 uVar1;
  uint8 *puVar2;
  bool bVar3;
  Limit limit;
  int iVar4;
  undefined8 in_RAX;
  uint32 byte_limit;
  int iVar5;
  uint32 length;
  uint32 temp;
  undefined8 local_38;
  
  puVar2 = input->buffer_;
  if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
    local_38._4_4_ = (int)((ulong)in_RAX >> 0x20);
    local_38 = CONCAT44(local_38._4_4_,(int)(char)uVar1);
    input->buffer_ = puVar2 + 1;
    byte_limit = (int)(char)uVar1;
  }
  else {
    local_38 = in_RAX;
    bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)&local_38);
    if (!bVar3) {
      return false;
    }
    byte_limit = (uint32)local_38;
  }
  limit = io::CodedInputStream::PushLimit(input,byte_limit);
  iVar4 = io::CodedInputStream::BytesUntilLimit(input);
  if (0 < iVar4) {
    do {
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
        input->buffer_ = puVar2 + 1;
        iVar4 = (int)(char)uVar1;
      }
      else {
        bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)((long)&local_38 + 4));
        if (!bVar3) {
          return false;
        }
        iVar4 = local_38._4_4_;
      }
      bVar3 = (*is_valid)(iVar4);
      if (bVar3) {
        iVar5 = values->current_size_;
        if (iVar5 == values->total_size_) {
          RepeatedField<int>::Reserve(values,iVar5 + 1);
          iVar5 = values->current_size_;
        }
        values->current_size_ = iVar5 + 1;
        values->elements_[iVar5] = iVar4;
      }
      iVar4 = io::CodedInputStream::BytesUntilLimit(input);
    } while (0 < iVar4);
  }
  io::CodedInputStream::PopLimit(input,limit);
  return true;
}

Assistant:

bool WireFormatLite::ReadPackedEnumNoInline(io::CodedInputStream* input,
                                            bool (*is_valid)(int),
                                            RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid(value)) {
      values->Add(value);
    }
  }
  input->PopLimit(limit);
  return true;
}